

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>::templated_iterator<const_slang::ast::Definition_*>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
::emplace_new_key<slang::ast::Definition_const*>
          (sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,Definition **key)

{
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::ast::Definition_*>_3 aVar1;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::ast::Definition_*>_3 in_RAX;
  long lVar2;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::ast::Definition_*>_3 aVar3;
  long lVar4;
  EntryPointer psVar5;
  Definition *pDVar6;
  sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
  sVar7;
  char __tmp_3;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>::templated_iterator<const_slang::ast::Definition_*>,_bool>
  pVar11;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::ast::Definition_*>_3 local_18;
  char cVar8;
  
  local_18 = in_RAX;
  if ((*(long *)(this + 8) != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
       )distance_from_desired)) {
    lVar2 = *(long *)(this + 0x18) + 1;
    auVar9._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar9._0_8_ = lVar2;
    auVar9._12_4_ = 0x45300000;
    lVar4 = *(long *)(this + 8) + 1;
    auVar10._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar10._0_8_ = lVar4;
    auVar10._12_4_ = 0x45300000;
    if ((auVar9._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar10._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0))) {
      cVar8 = current_entry->distance_from_desired;
      if (cVar8 < '\0') {
        pDVar6 = *key;
        (current_entry->field_1).value = pDVar6;
        current_entry->distance_from_desired = distance_from_desired;
        *(long *)(this + 0x18) = lVar2;
LAB_001f1a86:
        pVar11._9_7_ = (int7)((ulong)pDVar6 >> 8);
        pVar11.second = true;
        pVar11.first.current = current_entry;
        return pVar11;
      }
      pDVar6 = *key;
      current_entry->distance_from_desired = distance_from_desired;
      aVar3 = current_entry->field_1;
      (current_entry->field_1).value = pDVar6;
      pDVar6 = (Definition *)current_entry;
      do {
        sVar7 = (sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
                 )(cVar8 + '\x01');
        psVar5 = (EntryPointer)pDVar6;
        while( true ) {
          pDVar6 = (Definition *)(psVar5 + 1);
          cVar8 = ((EntryPointer)pDVar6)->distance_from_desired;
          if (cVar8 < '\0') {
            psVar5[1].field_1 = aVar3;
            ((EntryPointer)pDVar6)->distance_from_desired = (int8_t)sVar7;
            *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
            goto LAB_001f1a86;
          }
          if (cVar8 < (char)sVar7) break;
          sVar7 = (sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
                   )((char)sVar7 + '\x01');
          psVar5 = (EntryPointer)pDVar6;
          if (this[0x11] == sVar7) {
            local_18 = current_entry->field_1;
            current_entry->field_1 = aVar3;
            key = (Definition **)&local_18;
            goto LAB_001f1a98;
          }
        }
        ((EntryPointer)pDVar6)->distance_from_desired = (int8_t)sVar7;
        aVar1 = psVar5[1].field_1;
        psVar5[1].field_1 = aVar3;
        aVar3 = aVar1;
      } while( true );
    }
  }
LAB_001f1a98:
  sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
  ::grow((sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
          *)this);
  pVar11 = emplace<slang::ast::Definition_const*>(this,key);
  return pVar11;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }